

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O2

int Llb_Nonlin4Reachability(Llb_Mnx_t *p)

{
  Aig_Man_t *pAig;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  abctime aVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  abctime aVar10;
  abctime aVar11;
  abctime aVar12;
  Gia_ParLlb_t *pGVar13;
  Abc_Cex_t *pAVar14;
  int fVerbose;
  abctime time;
  abctime time_00;
  abctime time_01;
  uint uVar15;
  ulong uVar16;
  DdManager *pDVar17;
  char *pcVar18;
  Vec_Ptr_t **p_00;
  uint uVar19;
  double dVar20;
  double dVar21;
  Vec_Ptr_t *vStates;
  
  aVar7 = Abc_Clock();
  pAig = p->pAig;
  if (pAig->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                  ,0x2a3,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
  }
  pGVar13 = p->pPars;
  if (pGVar13->fBackward == 0) {
    if (pGVar13->fSkipOutCheck == 0) {
      pDVar17 = p->dd;
      if (pGVar13->fCluster != 0) {
        p->bBad = pDVar17->bFunc;
        goto LAB_006abe74;
      }
      pDVar8 = Llb_Nonlin4ComputeBad(pDVar17,pAig,p->vOrder);
      p->bBad = pDVar8;
      if (pDVar8 == (DdNode *)0x0) goto LAB_006ac3a1;
      Cudd_Ref(pDVar8);
      pDVar17 = p->dd;
    }
    else {
      pDVar17 = p->dd;
      if (pDVar17->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(pDVar17,pDVar17->bFunc);
        pDVar17 = p->dd;
LAB_006abe74:
        pDVar17->bFunc = (DdNode *)0x0;
      }
    }
    pDVar8 = Llb_Nonlin4ComputeInitState(pDVar17,p->pAig,p->vOrder,p->pPars->fBackward);
    p->bCurrent = pDVar8;
    Cudd_Ref(pDVar8);
LAB_006abea0:
    p->bReached = p->bCurrent;
    Cudd_Ref(p->bCurrent);
    pGVar13 = p->pPars;
    uVar16 = (ulong)(uint)pGVar13->nIterMax;
    iVar2 = 0;
    iVar3 = 0;
    uVar4 = 0;
    uVar15 = 0xffffffff;
    do {
      uVar19 = uVar15;
      uVar15 = uVar19 + 1;
      if ((int)uVar16 <= (int)uVar15) {
LAB_006ac1cb:
        if (pGVar13->fVerbose != 0) {
          dVar20 = Cudd_CountMinterm(p->dd,p->bReached,p->pAig->nRegs);
          if ((p->bCurrent == (DdNode *)0x0) ||
             (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) != 0x7fffffff)) {
            pcVar18 = "Reachability analysis is stopped after %d frames.\n";
          }
          else {
            pcVar18 = "Reachability analysis completed after %d frames.\n";
          }
          printf(pcVar18,(ulong)uVar15);
          dVar21 = ldexp(1.0,p->pAig->nRegs);
          printf("Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar20,(dVar20 * 100.0) / dVar21);
          fflush(_stdout);
        }
        if (p->bCurrent == (DdNode *)0x0) {
          pGVar13 = p->pPars;
        }
        else {
          pGVar13 = p->pPars;
          if (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff) {
            if (pGVar13->fSilent == 0) {
              printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar15);
              pGVar13 = p->pPars;
              if (pGVar13->fSilent == 0) {
                aVar10 = Abc_Clock();
                Abc_PrintTime(0x7bf12c,(char *)(aVar10 - aVar7),time_00);
                pGVar13 = p->pPars;
              }
            }
            pGVar13->iFrame = uVar19;
            return 1;
          }
        }
        if (pGVar13->fSilent == 0) {
          printf("Verified only for states reachable in %d frames.  ",(ulong)uVar15);
          pGVar13 = p->pPars;
        }
        pGVar13->iFrame = pGVar13->nIterMax;
        return -1;
      }
      aVar10 = Abc_Clock();
      if (p->pPars->TimeLimit != 0) {
        aVar11 = Abc_Clock();
        pGVar13 = p->pPars;
        if (pGVar13->TimeTarget < aVar11) {
          if (pGVar13->fSilent == 0) {
            printf("Reached timeout (%d seconds) during image computation.\n",
                   (ulong)(uint)pGVar13->TimeLimit);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar19;
          return -1;
        }
      }
      Vec_PtrPush(p->vRings,p->bCurrent);
      Cudd_Ref(p->bCurrent);
      if ((p->pPars->fSkipOutCheck == 0) &&
         (iVar1 = Cudd_bddLeq(p->dd,p->bCurrent,(DdNode *)((ulong)p->bBad ^ 1)), iVar1 == 0)) {
        if (p->pAig->pSeqModel == (Abc_Cex_t *)0x0) {
          vStates = Llb_Nonlin4DeriveCex(p,p->pPars->fBackward,fVerbose);
          p_00 = &vStates;
          pAVar14 = Llb4_Nonlin4TransformCex(p->pAig,vStates,-1,p->pPars->fVerbose);
          p->pAig->pSeqModel = pAVar14;
          Vec_PtrFreeP(p_00);
          pGVar13 = p->pPars;
          if (pGVar13->fSilent == 0) {
            Abc_Print((int)p_00,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                      (ulong)(uint)p->pAig->pSeqModel->iPo,p->pAig->pName,(ulong)(uVar19 + 1));
            aVar10 = Abc_Clock();
            Abc_PrintTime(0x7bf12c,(char *)(aVar10 - aVar7),time_01);
            pGVar13 = p->pPars;
          }
          pGVar13->iFrame = uVar19;
          return 0;
        }
        __assert_fail("p->pAig->pSeqModel == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb4Nonlin.c"
                      ,0x2f6,"int Llb_Nonlin4Reachability(Llb_Mnx_t *)");
      }
      aVar11 = Abc_Clock();
      pDVar8 = Llb_Nonlin4Image(p->dd,p->vRoots,p->bCurrent,p->vVars2Q);
      p->bNext = pDVar8;
      if (pDVar8 == (DdNode *)0x0) {
        pGVar13 = p->pPars;
        if (pGVar13->fSilent != 0) goto LAB_006ac268;
        uVar16 = (ulong)(uint)pGVar13->TimeLimit;
        pcVar18 = "Reached timeout (%d seconds) during image computation in quantification.\n";
        goto LAB_006ac25d;
      }
      Cudd_Ref(pDVar8);
      aVar12 = Abc_Clock();
      p->timeImage = p->timeImage + (aVar12 - aVar11);
      aVar11 = Abc_Clock();
      pDVar8 = p->bNext;
      pDVar9 = Cudd_bddVarMap(p->dd,pDVar8);
      p->bNext = pDVar9;
      if (pDVar9 == (DdNode *)0x0) {
        if (p->pPars->fSilent == 0) {
          printf("Reached timeout (%d seconds) during remapping next states.\n",
                 (ulong)(uint)p->pPars->TimeLimit);
        }
        Cudd_RecursiveDeref(p->dd,pDVar8);
        p->pPars->iFrame = uVar19;
        return -1;
      }
      Cudd_Ref(pDVar9);
      Cudd_RecursiveDeref(p->dd,pDVar8);
      aVar12 = Abc_Clock();
      p->timeRemap = p->timeRemap + (aVar12 - aVar11);
      if (p->pPars->fVerbose != 0) {
        iVar2 = Cudd_DagSize(p->bCurrent);
        iVar3 = Cudd_DagSize(pDVar8);
        uVar4 = Cudd_DagSize(p->bNext);
      }
      Cudd_RecursiveDeref(p->dd,p->bCurrent);
      p->bCurrent = (DdNode *)0x0;
      pDVar8 = Cudd_bddAnd(p->dd,p->bNext,(DdNode *)((ulong)p->bReached ^ 1));
      p->bCurrent = pDVar8;
      if (pDVar8 == (DdNode *)0x0) {
        pGVar13 = p->pPars;
        if (pGVar13->fSilent != 0) goto LAB_006ac268;
        uVar16 = (ulong)(uint)pGVar13->TimeLimit;
        pcVar18 = "Reached timeout (%d seconds) during image computation in transfer 1.\n";
        goto LAB_006ac25d;
      }
      Cudd_Ref(pDVar8);
      Cudd_RecursiveDeref(p->dd,p->bNext);
      p->bNext = (DdNode *)0x0;
      if (*(int *)((ulong)p->bCurrent & 0xfffffffffffffffe) == 0x7fffffff) {
        pGVar13 = p->pPars;
        goto LAB_006ac1cb;
      }
      pDVar8 = p->bReached;
      pDVar9 = Cudd_bddOr(p->dd,pDVar8,p->bCurrent);
      p->bReached = pDVar9;
      if (pDVar9 == (DdNode *)0x0) {
        pGVar13 = p->pPars;
        if (pGVar13->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                 (ulong)(uint)pGVar13->TimeLimit);
          pGVar13 = p->pPars;
        }
        pGVar13->iFrame = uVar19;
        Cudd_RecursiveDeref(p->dd,pDVar8);
        return -1;
      }
      Cudd_Ref(pDVar9);
      Cudd_RecursiveDeref(p->dd,pDVar8);
      pGVar13 = p->pPars;
      if (pGVar13->fVerbose != 0) {
        printf("I =%5d : ",(ulong)uVar15);
        printf("Fr =%7d  ",iVar2);
        printf("ImNs =%7d  ",iVar3);
        printf("ImCs =%7d  ",(ulong)uVar4);
        uVar5 = Cudd_DagSize(p->bReached);
        printf("Rea =%7d   ",(ulong)uVar5);
        uVar5 = Cudd_ReadReorderings(p->dd);
        uVar6 = Cudd_ReadGarbageCollections(p->dd);
        printf("(%4d %4d)  ",(ulong)uVar5,(ulong)uVar6);
        aVar11 = Abc_Clock();
        Abc_PrintTime(0x783014,(char *)(aVar11 - aVar10),time);
        pGVar13 = p->pPars;
      }
      uVar16 = (ulong)(uint)pGVar13->nIterMax;
    } while (uVar15 != pGVar13->nIterMax - 1U);
    uVar19 = uVar19 + 1;
    if (pGVar13->fSilent == 0) {
      pcVar18 = "Reached limit on the number of timeframes (%d).\n";
LAB_006ac25d:
      printf(pcVar18,uVar16);
      pGVar13 = p->pPars;
    }
LAB_006ac268:
    pGVar13->iFrame = uVar19;
  }
  else {
    if (pGVar13->fSkipOutCheck == 0) {
      pDVar8 = Llb_Nonlin4ComputeInitState(p->dd,pAig,p->vOrder,pGVar13->fBackward);
      p->bBad = pDVar8;
      Cudd_Ref(pDVar8);
      pGVar13 = p->pPars;
    }
    pDVar17 = p->dd;
    if (pGVar13->fCluster == 0) {
      pDVar8 = Llb_Nonlin4ComputeBad(pDVar17,p->pAig,p->vOrder);
      p->bCurrent = pDVar8;
      if (pDVar8 != (DdNode *)0x0) {
        Cudd_Ref(pDVar8);
        pDVar17 = p->dd;
        pDVar8 = p->bCurrent;
        goto LAB_006abdff;
      }
LAB_006ac3a1:
      pGVar13 = p->pPars;
      if (pGVar13->fSilent == 0) {
        printf("Reached timeout (%d seconds) during constructing the bad states.\n",
               (ulong)(uint)pGVar13->TimeLimit);
        goto LAB_006abe52;
      }
    }
    else {
      pDVar8 = pDVar17->bFunc;
      p->bCurrent = pDVar8;
      pDVar17->bFunc = (DdNode *)0x0;
LAB_006abdff:
      pDVar9 = Cudd_bddVarMap(pDVar17,pDVar8);
      p->bCurrent = pDVar9;
      if (pDVar9 != (DdNode *)0x0) {
        Cudd_Ref(pDVar9);
        Cudd_RecursiveDeref(p->dd,pDVar8);
        goto LAB_006abea0;
      }
      if (p->pPars->fSilent == 0) {
        printf("Reached timeout (%d seconds) during remapping bad states.\n",
               (ulong)(uint)p->pPars->TimeLimit);
      }
      Cudd_RecursiveDeref(p->dd,pDVar8);
LAB_006abe52:
      pGVar13 = p->pPars;
    }
    pGVar13->iFrame = -1;
  }
  return -1;
}

Assistant:

int Llb_Nonlin4Reachability( Llb_Mnx_t * p )
{ 
    DdNode * bAux;
    int nIters, nBddSizeFr = 0, nBddSizeTo = 0, nBddSizeTo2 = 0;
    abctime clkTemp, clkIter, clk = Abc_Clock();
    assert( Aig_ManRegNum(p->pAig) > 0 );

    if ( p->pPars->fBackward )
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            p->bBad = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bBad );
        }
        // create init state
        if ( p->pPars->fCluster )
            p->bCurrent = p->dd->bFunc, p->dd->bFunc = NULL; 
        else
        {
            p->bCurrent = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
            if ( p->bCurrent == NULL )
            {
                if ( !p->pPars->fSilent )
                    printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                p->pPars->iFrame = -1;
                return -1;
            }
            Cudd_Ref( p->bCurrent );
        }
        // remap into the next states
        p->bCurrent = Cudd_bddVarMap( p->dd, bAux = p->bCurrent );
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping bad states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = -1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, bAux );
    }
    else
    {
        // create bad state in the ring manager
        if ( !p->pPars->fSkipOutCheck )
        {
            if ( p->pPars->fCluster )
                p->bBad = p->dd->bFunc, p->dd->bFunc = NULL; 
            else
            {
                p->bBad = Llb_Nonlin4ComputeBad( p->dd, p->pAig, p->vOrder );          
                if ( p->bBad == NULL )
                {
                    if ( !p->pPars->fSilent )
                        printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
                    p->pPars->iFrame = -1;
                    return -1;
                }
                Cudd_Ref( p->bBad );
            }
        }
        else if ( p->dd->bFunc )
            Cudd_RecursiveDeref( p->dd, p->dd->bFunc ), p->dd->bFunc = NULL;
        // compute the starting set of states
        p->bCurrent = Llb_Nonlin4ComputeInitState( p->dd, p->pAig, p->vOrder, p->pPars->fBackward );  Cudd_Ref( p->bCurrent );
    }
    // perform iterations
    p->bReached = p->bCurrent; Cudd_Ref( p->bReached );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clkIter = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }

        // save the onion ring
        Vec_PtrPush( p->vRings, p->bCurrent );   Cudd_Ref( p->bCurrent );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->dd, p->bCurrent, Cudd_Not(p->bBad) ) ) 
        {
            Vec_Ptr_t * vStates;
            assert( p->pAig->pSeqModel == NULL );
            vStates = Llb_Nonlin4DeriveCex( p, p->pPars->fBackward, p->pPars->fVerbose ); 
            p->pAig->pSeqModel = Llb4_Nonlin4TransformCex( p->pAig, vStates, -1, p->pPars->fVerbose );
            Vec_PtrFreeP( &vStates );
            if ( !p->pPars->fSilent )
            {
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAig->pSeqModel->iPo, p->pAig->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            return 0;
        }

        // compute the next states
        clkTemp = Abc_Clock();
        p->bNext = Llb_Nonlin4Image( p->dd, p->vRoots, p->bCurrent, p->vVars2Q );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in quantification.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        p->timeImage += Abc_Clock() - clkTemp;

        // remap into current states
        clkTemp = Abc_Clock();
        p->bNext = Cudd_bddVarMap( p->dd, bAux = p->bNext );
        if ( p->bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during remapping next states.\n",  p->pPars->TimeLimit );
            Cudd_RecursiveDeref( p->dd, bAux );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bNext );
        Cudd_RecursiveDeref( p->dd, bAux );
        p->timeRemap += Abc_Clock() - clkTemp;

        // collect statistics
        if ( p->pPars->fVerbose )
        {
            nBddSizeFr  = Cudd_DagSize( p->bCurrent );
            nBddSizeTo  = Cudd_DagSize( bAux );
            nBddSizeTo2 = Cudd_DagSize( p->bNext );
        }
        Cudd_RecursiveDeref( p->dd, p->bCurrent ); p->bCurrent = NULL;

        // derive new states
        p->bCurrent = Cudd_bddAnd( p->dd, p->bNext, Cudd_Not(p->bReached) );     
        if ( p->bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            return -1;
        }
        Cudd_Ref( p->bCurrent );
        Cudd_RecursiveDeref( p->dd, p->bNext ); p->bNext = NULL;
        if ( Cudd_IsConstant(p->bCurrent) )
            break;
/*
        // reduce BDD size using constrain // Cudd_bddRestrict
        p->bCurrent = Cudd_bddRestrict( p->dd, bAux = p->bCurrent, Cudd_Not(p->bReached) );   
        Cudd_Ref( p->bCurrent );
printf( "Before = %d.  After = %d.\n", Cudd_DagSize(bAux), Cudd_DagSize(p->bCurrent) );
        Cudd_RecursiveDeref( p->dd, bAux );
*/

        // add to the reached set
        p->bReached = Cudd_bddOr( p->dd, bAux = p->bReached, p->bCurrent );                 
        if ( p->bReached == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd, bAux );  
            return -1;
        }
        Cudd_Ref( p->bReached );
        Cudd_RecursiveDeref( p->dd, bAux );  


        // report the results
        if ( p->pPars->fVerbose )
        {
            printf( "I =%5d : ",   nIters );
            printf( "Fr =%7d  ",   nBddSizeFr );
            printf( "ImNs =%7d  ", nBddSizeTo );
            printf( "ImCs =%7d  ", nBddSizeTo2 );
            printf( "Rea =%7d   ", Cudd_DagSize(p->bReached) );
            printf( "(%4d %4d)  ", Cudd_ReadReorderings(p->dd), Cudd_ReadGarbageCollections(p->dd) );
            Abc_PrintTime( 1, "T", Abc_Clock() - clkIter );
        }
/*
        if ( pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->dd, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->dd, bReached );printf( "\n" );
            printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
        if ( nIters == p->pPars->nIterMax - 1 )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached limit on the number of timeframes (%d).\n",  p->pPars->nIterMax );
            p->pPars->iFrame = nIters;
            return -1;
        }
    }
    
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->dd, p->bReached, Saig_ManRegNum(p->pAig) );
        if ( p->bCurrent && Cudd_IsConstant(p->bCurrent) )
            printf( "Reachability analysis completed after %d frames.\n", nIters );
        else
            printf( "Reachability analysis is stopped after %d frames.\n", nIters );
        printf( "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( p->bCurrent == NULL || !Cudd_IsConstant(p->bCurrent) )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        return -1; // undecided
    }
    // report
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    if ( !p->pPars->fSilent )
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}